

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isByteArray(Type *this)

{
  bool bVar1;
  bool bVar2;
  Type *pTVar3;
  
  pTVar3 = getCanonicalType(this);
  bVar1 = isUnpackedArray(pTVar3);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, (pTVar3->super_Symbol).kind != AssociativeArrayType)) {
    pTVar3 = getArrayElementType(pTVar3);
    pTVar3 = getCanonicalType(pTVar3);
    bVar2 = isPredefinedInteger(pTVar3);
    if (bVar2) {
      bVar2 = (int)pTVar3[1].super_Symbol.name._M_len == 3;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Type::isByteArray() const {
    const Type& ct = getCanonicalType();
    if (!ct.isUnpackedArray())
        return false;

    if (ct.kind == SymbolKind::AssociativeArrayType)
        return false;

    auto& elem = ct.getArrayElementType()->getCanonicalType();
    return elem.isPredefinedInteger() &&
           elem.as<PredefinedIntegerType>().integerKind == PredefinedIntegerType::Byte;
}